

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O2

ZyanStatus
ZydisFormatterIntelFormatInstruction
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  byte bVar1;
  int iVar2;
  ZydisDecodedOperand *pZVar3;
  uint __line;
  ZyanStatus ZVar4;
  void *pvVar5;
  ZydisFormatterFunc *pp_Var6;
  long lVar7;
  char *__assertion;
  void *state;
  ulong uVar8;
  ZydisDecorator ZStack_80;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assertion = "formatter";
    __line = 0x30;
  }
  else if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assertion = "buffer";
    __line = 0x31;
  }
  else if (context == (ZydisFormatterContext *)0x0) {
    __assertion = "context";
    __line = 0x32;
  }
  else if (context->instruction == (ZydisDecodedInstruction *)0x0) {
    __assertion = "context->instruction";
    __line = 0x33;
  }
  else {
    if (context->operands != (ZydisDecodedOperand *)0x0) {
      ZVar4 = (*formatter->func_print_prefixes)(formatter,buffer,context);
      if ((-1 < (int)ZVar4) &&
         (ZVar4 = (*formatter->func_print_mnemonic)(formatter,buffer,context), -1 < (int)ZVar4)) {
        if (buffer->is_token_list == '\0') {
          pvVar5 = (void *)(buffer->string).vector.size;
        }
        else {
          pvVar5 = (buffer->string).vector.data;
        }
        lVar7 = 0;
        for (uVar8 = 0; uVar8 < context->instruction->operand_count_visible; uVar8 = uVar8 + 1) {
          pZVar3 = context->operands;
          if (((uVar8 == 1) && (*(int *)((long)&pZVar3->type + lVar7) == 1)) &&
             (*(int *)((long)&pZVar3->encoding + lVar7) == 6)) goto LAB_00118ba8;
          if (buffer->is_token_list == '\0') {
            state = (void *)(buffer->string).vector.size;
            if (state == pvVar5) {
              ZVar4 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_MNEMONIC);
              state = pvVar5;
            }
            else {
              ZVar4 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_OPERAND);
            }
          }
          else {
            state = (buffer->string).vector.data;
            if (pvVar5 == state) {
              ZVar4 = ZydisFormatterBufferAppendPredefined
                                (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_MNEMONIC);
              state = pvVar5;
            }
            else {
              ZVar4 = ZydisFormatterBufferAppendPredefined
                                (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_OPERAND);
            }
          }
          if ((int)ZVar4 < 0) {
            return ZVar4;
          }
          context->operand = (ZydisDecodedOperand *)(&pZVar3->id + lVar7);
          if (formatter->func_pre_operand == (ZydisFormatterFunc)0x0) {
LAB_00118b17:
            pp_Var6 = &formatter->func_format_operand_reg;
            switch(*(undefined4 *)((long)&pZVar3->type + lVar7)) {
            case 1:
              break;
            case 2:
              pp_Var6 = &formatter->func_format_operand_mem;
              break;
            case 3:
              pp_Var6 = &formatter->func_format_operand_ptr;
              break;
            case 4:
              pp_Var6 = &formatter->func_format_operand_imm;
              break;
            default:
              return 0x80100004;
            }
            ZVar4 = (**pp_Var6)(formatter,buffer,context);
            if (ZVar4 == 0x20000b) goto LAB_00118b90;
            if ((int)ZVar4 < 0) {
              return ZVar4;
            }
            if (formatter->func_post_operand != (ZydisFormatterFunc)0x0) {
              ZVar4 = (*formatter->func_post_operand)(formatter,buffer,context);
              if (ZVar4 == 0x20000b) goto LAB_00118b90;
              if (-1 < (int)ZVar4) {
                return ZVar4;
              }
            }
            if ((context->instruction->encoding & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) ==
                ZYDIS_INSTRUCTION_ENCODING_EVEX) {
              if (((uVar8 == 0) && (1 < context->instruction->operand_count_visible)) &&
                 ((context->operands[1].encoding == ZYDIS_OPERAND_ENCODING_MASK &&
                  (ZVar4 = (*formatter->func_print_decorator)
                                     (formatter,buffer,context,ZYDIS_DECORATOR_MASK), (int)ZVar4 < 0
                  )))) {
                return ZVar4;
              }
              iVar2 = *(int *)((long)&pZVar3->type + lVar7);
              if (iVar2 != 2) {
                bVar1 = context->instruction->operand_count_visible;
                if ((int)uVar8 == bVar1 - 1) {
                  if (iVar2 != 4) goto LAB_00118c9f;
                }
                else if (((int)uVar8 + 1U < (uint)bVar1) &&
                        ((*(int *)((long)&context->operands[1].type + lVar7) == 4 ||
                         (*(int *)((long)&context->operands[1].visibility + lVar7) == 3)))) {
LAB_00118c9f:
                  if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) &&
                     (ZVar4 = (*formatter->func_print_decorator)
                                        (formatter,buffer,context,ZYDIS_DECORATOR_SWIZZLE),
                     (int)ZVar4 < 0)) {
                    return ZVar4;
                  }
                  ZVar4 = (*formatter->func_print_decorator)
                                    (formatter,buffer,context,ZYDIS_DECORATOR_RC);
                  if ((int)ZVar4 < 0) {
                    return ZVar4;
                  }
                  ZStack_80 = ZYDIS_DECORATOR_SAE;
                  goto LAB_00118ce4;
                }
                goto LAB_00118ba8;
              }
              ZVar4 = (*formatter->func_print_decorator)
                                (formatter,buffer,context,ZYDIS_DECORATOR_BC);
              if ((int)ZVar4 < 0) {
                return ZVar4;
              }
              if (context->instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE)
              goto LAB_00118ba8;
              ZVar4 = (*formatter->func_print_decorator)
                                (formatter,buffer,context,ZYDIS_DECORATOR_CONVERSION);
              if ((int)ZVar4 < 0) {
                return ZVar4;
              }
              ZStack_80 = ZYDIS_DECORATOR_EH;
LAB_00118ce4:
              ZVar4 = (*formatter->func_print_decorator)(formatter,buffer,context,ZStack_80);
              goto joined_r0x00118cee;
            }
          }
          else {
            ZVar4 = (*formatter->func_pre_operand)(formatter,buffer,context);
            if (ZVar4 != 0x20000b) {
              if ((int)ZVar4 < 0) {
                return ZVar4;
              }
              goto LAB_00118b17;
            }
LAB_00118b90:
            ZVar4 = ZydisFormatterBufferRestore(buffer,(ZyanUPointer)state);
joined_r0x00118cee:
            if ((int)ZVar4 < 0) {
              return ZVar4;
            }
          }
LAB_00118ba8:
          lVar7 = lVar7 + 0x50;
        }
        ZVar4 = 0x100000;
      }
      return ZVar4;
    }
    __assertion = "context->operands";
    __line = 0x34;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                ,__line,
                "ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
               );
}

Assistant:

ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(context->instruction);
    ZYAN_ASSERT(context->operands);

    ZYAN_CHECK(formatter->func_print_prefixes(formatter, buffer, context));
    ZYAN_CHECK(formatter->func_print_mnemonic(formatter, buffer, context));

    ZyanUPointer state_mnemonic;
    ZYDIS_BUFFER_REMEMBER(buffer, state_mnemonic);
    for (ZyanU8 i = 0; i < context->instruction->operand_count_visible; ++i)
    {
        const ZydisDecodedOperand* const operand = &context->operands[i];

        // Print embedded-mask registers as decorator instead of a regular operand
        if ((i == 1) && (operand->type == ZYDIS_OPERAND_TYPE_REGISTER) &&
            (operand->encoding == ZYDIS_OPERAND_ENCODING_MASK))
        {
            continue;
        }

        ZyanUPointer buffer_state;
        ZYDIS_BUFFER_REMEMBER(buffer, buffer_state);

        if (buffer_state != state_mnemonic)
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_OPERAND);
        } else
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_MNEMONIC);
        }

        // Set current operand
        context->operand = operand;

        ZyanStatus status;
        if (formatter->func_pre_operand)
        {
            status = formatter->func_pre_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (!ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

        switch (operand->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            status = formatter->func_format_operand_reg(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            status = formatter->func_format_operand_mem(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            status = formatter->func_format_operand_ptr(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            status = formatter->func_format_operand_imm(formatter, buffer, context);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        if (status == ZYDIS_STATUS_SKIP_TOKEN)
        {
            ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
            continue;
        }
        if (!ZYAN_SUCCESS(status))
        {
            return status;
        }

        if (formatter->func_post_operand)
        {
            status = formatter->func_post_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

#if !defined(ZYDIS_DISABLE_AVX512) || !defined(ZYDIS_DISABLE_KNC)
        if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) ||
            (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX))
        {
            if  ((i == 0) &&
                 (context->instruction->operand_count_visible > 1) &&
                 (context->operands[i + 1].encoding == ZYDIS_OPERAND_ENCODING_MASK))
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_MASK));
            }
            if (operand->type == ZYDIS_OPERAND_TYPE_MEMORY)
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_BC));
                if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                {
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_CONVERSION));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_EH));
                }
            } else
            {
                ZyanBool decorate_operand;
                if (i == (context->instruction->operand_count_visible - 1))
                {
                    decorate_operand = operand->type != ZYDIS_OPERAND_TYPE_IMMEDIATE;
                }
                else
                {
                    decorate_operand =
                        (context->instruction->operand_count_visible > (i + 1)) &&
                        ((context->operands[i + 1].type == ZYDIS_OPERAND_TYPE_IMMEDIATE) ||
                        (context->operands[i + 1].visibility == ZYDIS_OPERAND_VISIBILITY_HIDDEN));
                }
                if (decorate_operand)
                {
                    if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                    {
                        ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                            ZYDIS_DECORATOR_SWIZZLE));
                    }
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_RC));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_SAE));
                }
            }
        }
#endif
    }

    return ZYAN_STATUS_SUCCESS;
}